

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error asmjit::CodeHolder_reserveInternal(CodeHolder *self,CodeBuffer *cb,size_t n)

{
  Assembler *pAVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  Error EVar4;
  
  if ((cb->_data == (uint8_t *)0x0) || (cb->_isExternal != false)) {
    puVar3 = (uint8_t *)malloc(n);
  }
  else {
    puVar3 = (uint8_t *)realloc(cb->_data,n);
  }
  if (puVar3 == (uint8_t *)0x0) {
    EVar4 = 1;
  }
  else {
    cb->_data = puVar3;
    cb->_capacity = n;
    pAVar1 = self->_cgAsm;
    EVar4 = 0;
    if ((pAVar1 != (Assembler *)0x0) && (&pAVar1->_section->_buffer == cb)) {
      puVar2 = pAVar1->_bufferData;
      pAVar1->_bufferData = puVar3;
      pAVar1->_bufferEnd = puVar3 + n;
      pAVar1->_bufferPtr = puVar3 + ((long)pAVar1->_bufferPtr - (long)puVar2);
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

static Error CodeHolder_reserveInternal(CodeHolder* self, CodeBuffer* cb, size_t n) noexcept {
  uint8_t* oldData = cb->_data;
  uint8_t* newData;

  if (oldData && !cb->isExternal())
    newData = static_cast<uint8_t*>(Internal::reallocMemory(oldData, n));
  else
    newData = static_cast<uint8_t*>(Internal::allocMemory(n));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  cb->_data = newData;
  cb->_capacity = n;

  // Update the `Assembler` pointers if attached. Maybe we should introduce an
  // event for this, but since only one Assembler can be attached at a time it
  // should not matter how these pointers are updated.
  Assembler* a = self->_cgAsm;
  if (a && &a->_section->_buffer == cb) {
    size_t offset = a->getOffset();

    a->_bufferData = newData;
    a->_bufferEnd  = newData + n;
    a->_bufferPtr  = newData + offset;
  }

  return kErrorOk;
}